

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bounded_buffer * peparse::readFileToFileBuffer(char *filePath)

{
  int __fd;
  int iVar1;
  bounded_buffer *pbVar2;
  buffer_detail *pbVar3;
  uint8_t *puVar4;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  stat s;
  
  __fd = open(filePath,0);
  if (__fd == -1) {
    err = 7;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_f0,0xb8,f_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,":",
                   &local_f0);
    std::__cxx11::string::append((string *)err_loc_abi_cxx11_);
  }
  else {
    pbVar2 = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pbVar2 == (bounded_buffer *)0x0) {
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_f0,0xc0,f_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,":",
                     &local_f0);
      std::__cxx11::string::append((string *)err_loc_abi_cxx11_);
    }
    else {
      pbVar2->buf = (uint8_t *)0x0;
      pbVar2->bufLen = 0;
      pbVar2->copy = false;
      pbVar2->swapBytes = false;
      *(undefined2 *)&pbVar2->field_0xe = 0;
      pbVar2->detail = (buffer_detail *)0x0;
      pbVar3 = (buffer_detail *)operator_new(4,(nothrow_t *)&std::nothrow);
      if (pbVar3 != (buffer_detail *)0x0) {
        pbVar2->detail = pbVar3;
        pbVar3->fd = __fd;
        memset(&s,0,0x90);
        iVar1 = fstat(__fd,(stat *)&s);
        if (iVar1 == 0) {
          puVar4 = (uint8_t *)mmap((void *)0x0,s.st_size,1,1,__fd,0);
          if (puVar4 != (uint8_t *)0xffffffffffffffff) {
            pbVar2->buf = puVar4;
            pbVar2->bufLen = (uint32_t)s.st_size;
            pbVar2->copy = false;
            pbVar2->swapBytes = false;
            return pbVar2;
          }
          close(__fd);
          operator_delete(pbVar3,4);
          operator_delete(pbVar2,0x18);
          err = 1;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>(&local_d0,0xff,f_03);
          std::operator+(&local_f0,":",&local_d0);
          std::__cxx11::string::append((string *)err_loc_abi_cxx11_);
        }
        else {
          close(__fd);
          operator_delete(pbVar3,4);
          operator_delete(pbVar2,0x18);
          err = 8;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>(&local_d0,0xf0,f);
          std::operator+(&local_f0,":",&local_d0);
          std::__cxx11::string::append((string *)err_loc_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)&local_f0);
        this = &local_d0;
        goto LAB_001115be;
      }
      operator_delete(pbVar2,0x18);
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_f0,0xc9,f_02);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,":",
                     &local_f0);
      std::__cxx11::string::append((string *)err_loc_abi_cxx11_);
    }
  }
  std::__cxx11::string::~string((string *)&s);
  this = &local_f0;
LAB_001115be:
  std::__cxx11::string::~string((string *)this);
  return (bounded_buffer *)0x0;
}

Assistant:

bounded_buffer *readFileToFileBuffer(const char *filePath) {
#ifdef WIN32
  HANDLE h = CreateFileA(filePath,
                         GENERIC_READ,
                         FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE,
                         nullptr,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         nullptr);
  if (h == INVALID_HANDLE_VALUE) {
    return nullptr;
  }

  DWORD fileSize = GetFileSize(h, nullptr);

  if (fileSize == INVALID_FILE_SIZE) {
    CloseHandle(h);
    return nullptr;
  }

#else
  // only where we have mmap / open / etc
  int fd = open(filePath, O_RDONLY);

  if (fd == -1) {
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }
#endif

  // make a buffer object
  bounded_buffer *p = new (std::nothrow) bounded_buffer();
  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  memset(p, 0, sizeof(bounded_buffer));
  buffer_detail *d = new (std::nothrow) buffer_detail();

  if (d == nullptr) {
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }
  memset(d, 0, sizeof(buffer_detail));
  p->detail = d;

// only where we have mmap / open / etc
#ifdef WIN32
  p->detail->file = h;

  HANDLE hMap = CreateFileMapping(h, nullptr, PAGE_READONLY, 0, 0, nullptr);

  if (hMap == nullptr) {
    CloseHandle(h);
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->detail->sec = hMap;

  LPVOID ptr = MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);

  if (ptr == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = (::uint8_t *) ptr;
  p->bufLen = fileSize;
#else
  p->detail->fd = fd;

  struct stat s;
  memset(&s, 0, sizeof(struct stat));

  if (fstat(fd, &s) != 0) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_STAT);
    return nullptr;
  }

  void *maddr = mmap(nullptr,
                     static_cast<std::size_t>(s.st_size),
                     PROT_READ,
                     MAP_SHARED,
                     fd,
                     0);

  if (maddr == MAP_FAILED) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = reinterpret_cast<std::uint8_t *>(maddr);
  p->bufLen = static_cast<std::uint32_t>(s.st_size);
#endif
  p->copy = false;
  p->swapBytes = false;

  return p;
}